

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O0

Status * __thiscall draco::PlyDecoder::DecodeFaceData(PlyDecoder *this,PlyElement *face_element)

{
  bool bVar1;
  int iVar2;
  PlyProperty *this_00;
  reference pvVar3;
  PlyElement *in_RDX;
  long in_RSI;
  Status *in_RDI;
  int64_t c;
  int64_t ti;
  int64_t num_triangles;
  int64_t list_size;
  int64_t list_offset;
  int i;
  FaceIndex face_index;
  Face face;
  PlyPropertyReader<unsigned_int> vertex_index_reader;
  int64_t num_polygons;
  PlyProperty *vertex_indices;
  undefined4 in_stack_fffffffffffffe48;
  Code in_stack_fffffffffffffe4c;
  PlyProperty *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  ThisIndexType in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  PlyElement *in_stack_fffffffffffffe68;
  Mesh *in_stack_fffffffffffffe70;
  Mesh *this_01;
  allocator<char> *in_stack_fffffffffffffe80;
  allocator<char> *__a;
  PlyProperty *in_stack_fffffffffffffe88;
  PlyElement *in_stack_fffffffffffffe90;
  PlyProperty *in_stack_fffffffffffffe98;
  uint local_124;
  long local_120;
  long local_118;
  uint local_10c;
  undefined1 *local_108;
  PlyElement *local_100;
  Mesh *local_f8;
  int local_ec;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_e8 [14];
  long local_b0;
  allocator<char> local_a1;
  string local_a0 [39];
  undefined1 local_79 [56];
  allocator<char> local_41;
  string local_40 [32];
  PlyProperty *local_20;
  PlyElement *local_18;
  
  if (in_RDX == (PlyElement *)0x0) {
    OkStatus();
  }
  else {
    local_18 = in_RDX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffffe90->name_,(char *)in_stack_fffffffffffffe88,
               in_stack_fffffffffffffe80);
    this_00 = PlyElement::GetPropertyByName
                        (in_stack_fffffffffffffe68,
                         (string *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    local_20 = this_00;
    if (this_00 == (PlyProperty *)0x0) {
      in_stack_fffffffffffffe98 = (PlyProperty *)local_79;
      in_stack_fffffffffffffe90 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffe90->name_,(char *)in_stack_fffffffffffffe88,
                 in_stack_fffffffffffffe80);
      in_stack_fffffffffffffe88 =
           PlyElement::GetPropertyByName
                     (in_stack_fffffffffffffe68,
                      (string *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      local_20 = in_stack_fffffffffffffe88;
      std::__cxx11::string::~string((string *)(local_79 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_79);
    }
    if ((local_20 == (PlyProperty *)0x0) || (bVar1 = PlyProperty::is_list(local_20), !bVar1)) {
      __a = &local_a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffe90->name_,(char *)in_stack_fffffffffffffe88,__a);
      Status::Status((Status *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                     (string *)0x129e74);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator(&local_a1);
    }
    else {
      this_01 = *(Mesh **)(in_RSI + 0x38);
      anon_unknown_23::CountNumTriangles
                ((PlyElement *)in_stack_fffffffffffffe70,(PlyProperty *)in_stack_fffffffffffffe68);
      Mesh::SetNumFaces(in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
      iVar2 = PlyElement::num_entries(local_18);
      local_b0 = (long)iVar2;
      PlyPropertyReader<unsigned_int>::PlyPropertyReader
                ((PlyPropertyReader<unsigned_int> *)this_00,in_stack_fffffffffffffe98);
      std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::array
                ((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(local_e8,0);
      for (local_ec = 0; local_ec < local_b0; local_ec = local_ec + 1) {
        in_stack_fffffffffffffe70 =
             (Mesh *)PlyProperty::GetListEntryOffset
                               (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        local_f8 = in_stack_fffffffffffffe70;
        in_stack_fffffffffffffe68 =
             (PlyElement *)
             PlyProperty::GetListEntryNumValues(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c)
        ;
        local_100 = in_stack_fffffffffffffe68;
        if (2 < (long)in_stack_fffffffffffffe68) {
          local_108 = (undefined1 *)
                      ((long)&in_stack_fffffffffffffe68[-1].property_index_._M_t._M_impl.
                              super__Rb_tree_header._M_node_count + 6);
          local_10c = PlyPropertyReader<unsigned_int>::ReadValue
                                ((PlyPropertyReader<unsigned_int> *)in_stack_fffffffffffffe50,
                                 in_stack_fffffffffffffe4c);
          pvVar3 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                   operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                               *)in_stack_fffffffffffffe50,
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator=(pvVar3,&local_10c);
          for (local_118 = 0; local_118 < (long)local_108; local_118 = local_118 + 1) {
            for (local_120 = 1; local_120 < 3; local_120 = local_120 + 1) {
              local_124 = PlyPropertyReader<unsigned_int>::ReadValue
                                    ((PlyPropertyReader<unsigned_int> *)in_stack_fffffffffffffe50,
                                     in_stack_fffffffffffffe4c);
              pvVar3 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                       ::operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                                     *)in_stack_fffffffffffffe50,
                                    CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
              IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator=(pvVar3,&local_124);
            }
            Mesh::SetFace(this_01,(FaceIndex)(uint)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                          (Face *)in_stack_fffffffffffffe70);
            in_stack_fffffffffffffe5c =
                 IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++
                           ((IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)
                            CONCAT44(in_stack_fffffffffffffe5c.value_,in_stack_fffffffffffffe58),
                            (int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
          }
        }
      }
      IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(local_e8);
      Mesh::SetNumFaces(in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
      OkStatus();
      PlyPropertyReader<unsigned_int>::~PlyPropertyReader
                ((PlyPropertyReader<unsigned_int> *)0x12a1e4);
    }
  }
  return in_RDI;
}

Assistant:

Status PlyDecoder::DecodeFaceData(const PlyElement *face_element) {
  // We accept point clouds now.
  if (face_element == nullptr) {
    return OkStatus();
  }
  const PlyProperty *vertex_indices =
      face_element->GetPropertyByName("vertex_indices");
  if (vertex_indices == nullptr) {
    // The property name may be named either "vertex_indices" or "vertex_index".
    vertex_indices = face_element->GetPropertyByName("vertex_index");
  }
  if (vertex_indices == nullptr || !vertex_indices->is_list()) {
    return Status(Status::DRACO_ERROR, "No faces defined");
  }

  // Allocate faces.
  out_mesh_->SetNumFaces(CountNumTriangles(*face_element, *vertex_indices));
  const int64_t num_polygons = face_element->num_entries();

  PlyPropertyReader<PointIndex::ValueType> vertex_index_reader(vertex_indices);
  Mesh::Face face;
  FaceIndex face_index(0);
  for (int i = 0; i < num_polygons; ++i) {
    const int64_t list_offset = vertex_indices->GetListEntryOffset(i);
    const int64_t list_size = vertex_indices->GetListEntryNumValues(i);
    if (list_size < 3) {
      continue;  // All invalid polygons are skipped.
    }

    // Triangulate polygon assuming the polygon is convex.
    const int64_t num_triangles = list_size - 2;
    face[0] = vertex_index_reader.ReadValue(static_cast<int>(list_offset));
    for (int64_t ti = 0; ti < num_triangles; ++ti) {
      for (int64_t c = 1; c < 3; ++c) {
        face[c] = vertex_index_reader.ReadValue(
            static_cast<int>(list_offset + ti + c));
      }
      out_mesh_->SetFace(face_index, face);
      face_index++;
    }
  }
  out_mesh_->SetNumFaces(face_index.value());
  return OkStatus();
}